

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_add_digits(sexp ctx,sexp dst,sexp a,sexp b)

{
  ulong uVar1;
  long lVar2;
  sexp b_00;
  sexp psVar3;
  sexp psVar4;
  ulong uVar5;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp c;
  sexp_uint_t *cdata;
  sexp_uint_t *bdata;
  sexp_uint_t *adata;
  sexp_uint_t p_sum;
  sexp_uint_t old_a;
  sexp_uint_t i;
  sexp_uint_t carry;
  sexp_uint_t blen;
  sexp_uint_t alen;
  sexp local_90;
  undefined1 *len0;
  sexp a_00;
  sexp psVar6;
  sexp in_stack_ffffffffffffff90;
  sexp local_48;
  long local_40;
  sexp local_8;
  
  b_00 = (sexp)sexp_bignum_hi(in_RDX);
  psVar3 = (sexp)sexp_bignum_hi(in_RCX);
  local_40 = 0;
  psVar6 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffff78,0,0x10);
  if (b_00 < psVar3) {
    local_8 = sexp_bignum_add_digits(in_RSI,in_RDX,in_RCX,b_00);
  }
  else {
    len0 = &stack0xffffffffffffff88;
    a_00 = *(sexp *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff78;
    if ((in_RSI == (sexp)0x0) ||
       (local_90 = in_RSI, psVar4 = (sexp)sexp_bignum_hi(in_RSI), psVar4 < b_00)) {
      local_90 = sexp_copy_bignum(in_stack_ffffffffffffff90,psVar6,a_00,(sexp_uint_t)len0);
    }
    psVar6 = (sexp)((long)&local_90->value + 0x10);
    for (local_48 = (sexp)0x0; local_48 < psVar3; local_48 = (sexp)((long)&local_48->tag + 1)) {
      uVar1 = *(ulong *)((long)&in_RDX->value + (long)local_48 * 8 + 0x10);
      uVar5 = *(long *)((long)&in_RDX->value + (long)local_48 * 8 + 0x10) +
              *(long *)((long)&in_RCX->value + (long)local_48 * 8 + 0x10);
      *(ulong *)(&psVar6->tag + (long)local_48 * 2) = uVar5 + local_40;
      local_40 = (long)(int)((uint)(-*(long *)((long)&in_RCX->value + (long)local_48 * 8 + 0x10) -
                                    1U < uVar1) + (uint)(-local_40 - 1U < uVar5));
    }
    while (local_40 != 0 && local_48 < b_00) {
      lVar2 = *(long *)(&psVar6->tag + (long)local_48 * 2);
      *(long *)(&psVar6->tag + (long)local_48 * 2) =
           *(long *)(&psVar6->tag + (long)local_48 * 2) + 1;
      local_48 = (sexp)((long)&local_48->tag + 1);
      local_40 = (long)(int)(uint)(lVar2 == -1);
    }
    if (local_40 != 0) {
      local_90 = sexp_copy_bignum(psVar6,local_90,a_00,(sexp_uint_t)len0);
      *(undefined8 *)((long)&local_90->value + (long)b_00 * 8 + 0x10) = 1;
    }
    *(sexp *)(in_RDI + 0x6080) = a_00;
    local_8 = local_90;
  }
  return local_8;
}

Assistant:

sexp sexp_bignum_add_digits (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp_uint_t alen=sexp_bignum_hi(a), blen=sexp_bignum_hi(b),
    carry=0, i, old_a, p_sum, *adata, *bdata, *cdata;
  sexp_gc_var1(c);
  if (alen < blen) return sexp_bignum_add_digits(ctx, dst, b, a);
  sexp_gc_preserve1(ctx, c);
  c = ((dst && sexp_bignum_hi(dst) >= alen)
       ? dst : sexp_copy_bignum(ctx, NULL, a, 0));
  adata = sexp_bignum_data(a);
  bdata = sexp_bignum_data(b);
  cdata = sexp_bignum_data(c);
  for (i=0; i<blen; i++) {
    old_a = adata[i]; /* adata may alias cdata */
    p_sum = adata[i] + bdata[i];
    cdata[i] = p_sum + carry;
    carry = (old_a > (SEXP_UINT_T_MAX - bdata[i]) ? 1 : 0)
          + (p_sum > (SEXP_UINT_T_MAX - carry) ? 1 : 0);
  }
  for ( ; carry && (i<alen); i++) {
    carry = (cdata[i] == SEXP_UINT_T_MAX ? 1 : 0);
    cdata[i]++;
  }
  if (carry) {
    c = sexp_copy_bignum(ctx, NULL, c, alen+1);
    sexp_bignum_data(c)[alen] = 1;
  }
  sexp_gc_release1(ctx);
  return c;
}